

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

int Gia_ManFilterEquivsForSpeculation
              (Gia_Man_t *pGia,char *pName1,char *pName2,int fLatchA,int fLatchB)

{
  Gia_Obj_t *__s2;
  int iVar1;
  int iVar2;
  Gia_Man_t *p0;
  Gia_Man_t *p1;
  Gia_Man_t *p;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_80;
  int local_7c;
  int ClassB;
  int ClassA;
  int Counter;
  int iNext;
  int iObj;
  int i;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObjM;
  Gia_Obj_t *pObj2;
  Gia_Obj_t *pObj1;
  Gia_Man_t *pMiter;
  Gia_Man_t *pGia2;
  Gia_Man_t *pGia1;
  int fLatchB_local;
  int fLatchA_local;
  char *pName2_local;
  char *pName1_local;
  Gia_Man_t *pGia_local;
  
  ClassB = 0;
  if ((pGia->pReprs == (Gia_Rpr_t *)0x0) || (pGia->pNexts == (int *)0x0)) {
    Abc_Print(1,"Equivalences are not defined.\n");
    pGia_local._4_4_ = 0;
  }
  else {
    p0 = Gia_AigerRead(pName1,0,0,0);
    if (p0 == (Gia_Man_t *)0x0) {
      Abc_Print(1,"Cannot read first file %s.\n",pName1);
      pGia_local._4_4_ = 0;
    }
    else {
      p1 = Gia_AigerRead(pName2,0,0,0);
      if (p1 == (Gia_Man_t *)0x0) {
        Gia_ManStop((Gia_Man_t *)0x0);
        Abc_Print(1,"Cannot read second file %s.\n",pName2);
        pGia_local._4_4_ = 0;
      }
      else {
        p = Gia_ManMiter(p0,p1,0,0,1,0,0);
        if (p == (Gia_Man_t *)0x0) {
          Gia_ManStop(p0);
          Gia_ManStop(p1);
          Abc_Print(1,"Cannot create sequential miter.\n");
          pGia_local._4_4_ = 0;
        }
        else {
          iVar1 = Gia_ManObjNum(pGia);
          iVar2 = Gia_ManObjNum(p);
          if (iVar1 == iVar2) {
            pGVar3 = pGia->pObjs;
            __s2 = p->pObjs;
            iVar1 = Gia_ManObjNum(pGia);
            iVar1 = memcmp(pGVar3,__s2,(long)iVar1 * 0xc);
            if (iVar1 == 0) {
              Gia_ManCleanMark0(pGia);
              iNext = 0;
              while( true ) {
                bVar4 = false;
                if (iNext < p0->nObjs) {
                  pObj2 = Gia_ManObj(p0,iNext);
                  bVar4 = pObj2 != (Gia_Obj_t *)0x0;
                }
                if (!bVar4) break;
                if (pObj2->Value != 0xffffffff) {
                  iVar1 = Abc_Lit2Var(pObj2->Value);
                  pGVar3 = Gia_ManObj(p,iVar1);
                  iVar1 = Gia_ObjId(p,pGVar3);
                  pGVar3 = Gia_ManObj(pGia,iVar1);
                  *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0xffffffffbfffffff | 0x40000000;
                }
                iNext = iNext + 1;
              }
              Gia_ManCleanMark1(pGia);
              iNext = 0;
              while( true ) {
                bVar4 = false;
                if (iNext < p1->nObjs) {
                  pObjM = Gia_ManObj(p1,iNext);
                  bVar4 = pObjM != (Gia_Obj_t *)0x0;
                }
                if (!bVar4) break;
                if (pObjM->Value != 0xffffffff) {
                  iVar1 = Abc_Lit2Var(pObjM->Value);
                  pGVar3 = Gia_ManObj(p,iVar1);
                  iVar1 = Gia_ObjId(p,pGVar3);
                  pGVar3 = Gia_ManObj(pGia,iVar1);
                  *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0xbfffffffffffffff | 0x4000000000000000;
                }
                iNext = iNext + 1;
              }
              for (iNext = 1; iVar1 = Gia_ManObjNum(pGia), iNext < iVar1; iNext = iNext + 1) {
                iVar1 = Gia_ObjIsConst(pGia,iNext);
                if ((iVar1 != 0) && (Gia_ObjUnsetRepr(pGia,iNext), pGia->pNexts[iNext] != 0)) {
                  __assert_fail("pGia->pNexts[i] == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                                ,0x8e6,
                                "int Gia_ManFilterEquivsForSpeculation(Gia_Man_t *, char *, char *, int, int)"
                               );
                }
              }
              for (iNext = 1; iVar1 = Gia_ManObjNum(pGia), iNext < iVar1; iNext = iNext + 1) {
                iVar1 = Gia_ObjIsHead(pGia,iNext);
                if (iVar1 != 0) {
                  local_7c = -1;
                  local_80 = -1;
                  iVar1 = Gia_ObjIsHead(pGia,iNext);
                  if (iVar1 == 0) {
                    __assert_fail("Gia_ObjIsHead(pGia, i)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                                  ,0x8ec,
                                  "int Gia_ManFilterEquivsForSpeculation(Gia_Man_t *, char *, char *, int, int)"
                                 );
                  }
                  for (Counter = iNext; 0 < Counter; Counter = Gia_ObjNext(pGia,Counter)) {
                    pGVar3 = Gia_ManObj(pGia,Counter);
                    if (((local_7c == -1) && ((*(ulong *)pGVar3 >> 0x1e & 1) != 0)) &&
                       ((*(ulong *)pGVar3 >> 0x3e & 1) == 0)) {
                      if ((fLatchA == 0) || (iVar1 = Gia_ObjIsRo(pGia,pGVar3), iVar1 != 0)) {
                        local_7c = Counter;
                        goto LAB_00205bd5;
                      }
                    }
                    else {
LAB_00205bd5:
                      if (((local_80 == -1) && ((*(ulong *)pGVar3 >> 0x3e & 1) != 0)) &&
                         (((*(ulong *)pGVar3 >> 0x1e & 1) == 0 &&
                          ((fLatchB == 0 || (iVar1 = Gia_ObjIsRo(pGia,pGVar3), iVar1 != 0)))))) {
                        local_80 = Counter;
                      }
                    }
                  }
                  Counter = iNext;
                  ClassA = Gia_ObjNext(pGia,iNext);
                  while (Counter != 0) {
                    Gia_ObjUnsetRepr(pGia,Counter);
                    Gia_ObjSetNext(pGia,Counter,0);
                    Counter = ClassA;
                    ClassA = Gia_ObjNext(pGia,ClassA);
                  }
                  iVar1 = Gia_ObjIsHead(pGia,iNext);
                  if (iVar1 != 0) {
                    __assert_fail("!Gia_ObjIsHead(pGia, i)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                                  ,0x903,
                                  "int Gia_ManFilterEquivsForSpeculation(Gia_Man_t *, char *, char *, int, int)"
                                 );
                  }
                  if ((0 < local_7c) && (0 < local_80)) {
                    if (local_80 < local_7c) {
                      iVar1 = local_7c;
                      local_7c = local_80;
                      local_80 = iVar1;
                    }
                    if (local_80 <= local_7c) {
                      __assert_fail("ClassA < ClassB",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                                    ,0x90c,
                                    "int Gia_ManFilterEquivsForSpeculation(Gia_Man_t *, char *, char *, int, int)"
                                   );
                    }
                    Gia_ObjSetNext(pGia,local_7c,local_80);
                    Gia_ObjSetRepr(pGia,local_80,local_7c);
                    ClassB = ClassB + 1;
                    iVar1 = Gia_ObjIsHead(pGia,local_7c);
                    if (iVar1 == 0) {
                      __assert_fail("Gia_ObjIsHead(pGia, ClassA)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                                    ,0x910,
                                    "int Gia_ManFilterEquivsForSpeculation(Gia_Man_t *, char *, char *, int, int)"
                                   );
                    }
                  }
                }
              }
              Abc_Print(1,"The number of two-node classes after filtering = %d.\n",
                        (ulong)(uint)ClassB);
              Gia_ManCleanMark0(pGia);
              Gia_ManCleanMark1(pGia);
              pGia_local._4_4_ = 1;
            }
            else {
              Gia_ManStop(p0);
              Gia_ManStop(p1);
              Gia_ManStop(p);
              Abc_Print(1,"The AIG structure of the miter does not match.\n");
              pGia_local._4_4_ = 0;
            }
          }
          else {
            Gia_ManStop(p0);
            Gia_ManStop(p1);
            Gia_ManStop(p);
            Abc_Print(1,"The number of objects in different.\n");
            pGia_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return pGia_local._4_4_;
}

Assistant:

int Gia_ManFilterEquivsForSpeculation( Gia_Man_t * pGia, char * pName1, char * pName2, int fLatchA, int fLatchB )
{
    Gia_Man_t * pGia1, * pGia2, * pMiter;
    Gia_Obj_t * pObj1, * pObj2, * pObjM, * pObj;
    int i, iObj, iNext, Counter = 0;
    if ( pGia->pReprs == NULL || pGia->pNexts == NULL )
    {
        Abc_Print( 1, "Equivalences are not defined.\n" );
        return 0;
    }
    pGia1 = Gia_AigerRead( pName1, 0, 0, 0 );
    if ( pGia1 == NULL )
    {
        Abc_Print( 1, "Cannot read first file %s.\n", pName1 );
        return 0;
    }
    pGia2 = Gia_AigerRead( pName2, 0, 0, 0 );
    if ( pGia2 == NULL )
    {
        Gia_ManStop( pGia2 );
        Abc_Print( 1, "Cannot read second file %s.\n", pName2 );
        return 0;
    }
    pMiter = Gia_ManMiter( pGia1, pGia2, 0, 0, 1, 0, 0 );
    if ( pMiter == NULL )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Abc_Print( 1, "Cannot create sequential miter.\n" );
        return 0;
    }
    // make sure the miter is isomorphic
    if ( Gia_ManObjNum(pGia) != Gia_ManObjNum(pMiter) )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Gia_ManStop( pMiter );
        Abc_Print( 1, "The number of objects in different.\n" );
        return 0;
    }
    if ( memcmp( pGia->pObjs, pMiter->pObjs, sizeof(Gia_Obj_t) *  Gia_ManObjNum(pGia) ) )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Gia_ManStop( pMiter );
        Abc_Print( 1, "The AIG structure of the miter does not match.\n" );
        return 0;
    }
    // transfer copies
    Gia_ManCleanMark0( pGia );
    Gia_ManForEachObj( pGia1, pObj1, i )
    {
        if ( pObj1->Value == ~0 )
            continue;
        pObjM = Gia_ManObj( pMiter, Abc_Lit2Var(pObj1->Value) );
        pObj = Gia_ManObj( pGia, Gia_ObjId(pMiter, pObjM) );
        pObj->fMark0 = 1;
    }
    Gia_ManCleanMark1( pGia );
    Gia_ManForEachObj( pGia2, pObj2, i )
    {
        if ( pObj2->Value == ~0 )
            continue;
        pObjM = Gia_ManObj( pMiter, Abc_Lit2Var(pObj2->Value) );
        pObj = Gia_ManObj( pGia, Gia_ObjId(pMiter, pObjM) );
        pObj->fMark1 = 1;
    }

    // filter equivalences
    Gia_ManForEachConst( pGia, i )
    {
        Gia_ObjUnsetRepr( pGia, i );
        assert( pGia->pNexts[i] == 0 );
    }
    Gia_ManForEachClass( pGia, i )
    {
        // find the first colorA and colorB
        int ClassA = -1, ClassB = -1;
        Gia_ClassForEachObj( pGia, i, iObj )
        {
            pObj = Gia_ManObj( pGia, iObj );
            if ( ClassA == -1 && pObj->fMark0 && !pObj->fMark1 )
            {
                if ( fLatchA && !Gia_ObjIsRo(pGia, pObj) )
                    continue;
                ClassA = iObj;
            }
            if ( ClassB == -1 && pObj->fMark1 && !pObj->fMark0 )
            {
                if ( fLatchB && !Gia_ObjIsRo(pGia, pObj) )
                    continue;
                ClassB = iObj;
            }
        }
        // undo equivalence classes
        for ( iObj = i, iNext = Gia_ObjNext(pGia, iObj); iObj;
              iObj = iNext, iNext = Gia_ObjNext(pGia, iObj) )
        {
            Gia_ObjUnsetRepr( pGia, iObj );
            Gia_ObjSetNext( pGia, iObj, 0 );
        }
        assert( !Gia_ObjIsHead(pGia, i) );
        if ( ClassA > 0 && ClassB > 0 )
        {
            if ( ClassA > ClassB )
            {
                ClassA ^= ClassB;
                ClassB ^= ClassA;
                ClassA ^= ClassB;
            }
            assert( ClassA < ClassB );
            Gia_ObjSetNext( pGia, ClassA, ClassB );
            Gia_ObjSetRepr( pGia, ClassB, ClassA );
            Counter++;
            assert( Gia_ObjIsHead(pGia, ClassA) );
        }
    }
    Abc_Print( 1, "The number of two-node classes after filtering = %d.\n", Counter );
//Gia_ManEquivPrintClasses( pGia, 1, 0 );

    Gia_ManCleanMark0( pGia );
    Gia_ManCleanMark1( pGia );
    return 1;
}